

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

void __thiscall YAML::Emitter::BlockMapPrepareLongKey(Emitter *this,value child)

{
  ostream_wrapper *stream;
  _Head_base<0UL,_YAML::EmitterState_*,_false> _Var1;
  size_t sVar2;
  size_t in_RAX;
  size_t sVar3;
  IndentTo local_28;
  
  _Var1._M_head_impl =
       (this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
  sVar2 = (_Var1._M_head_impl)->m_curIndent;
  local_28.n = in_RAX;
  sVar3 = EmitterState::CurGroupChildCount(_Var1._M_head_impl);
  if (child != NoType) {
    _Var1._M_head_impl =
         (this->m_pState)._M_t.
         super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
         super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
         super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl;
    if (((_Var1._M_head_impl)->m_hasAnchor == false) && (((_Var1._M_head_impl)->m_hasTag & 1U) == 0)
       ) {
      if (sVar3 != 0) {
        YAML::operator<<(&this->m_stream,(char (*) [2])0x6ecc3e);
      }
      stream = &this->m_stream;
      if ((this->m_stream).m_comment == true) {
        YAML::operator<<(stream,(char (*) [2])0x6ecc3e);
      }
      local_28.n = sVar2;
      YAML::operator<<(stream,&local_28);
      YAML::operator<<(stream,(char (*) [2])0x6eae51);
    }
    if (child < (BlockMap|Property)) {
      if ((0x2eU >> (child & 0x1f) & 1) == 0) {
        if (((0x50U >> (child & 0x1f) & 1) != 0) &&
           ((_Var1._M_head_impl =
                  (this->m_pState)._M_t.
                  super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>
                  .super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl,
            (_Var1._M_head_impl)->m_hasAnchor != false ||
            (((_Var1._M_head_impl)->m_hasTag & 1U) != 0)))) {
          YAML::operator<<(&this->m_stream,(char (*) [2])0x6ecc3e);
        }
      }
      else {
        SpaceOrIndentTo(this,true,sVar2 + 1);
      }
    }
  }
  return;
}

Assistant:

void Emitter::BlockMapPrepareLongKey(EmitterNodeType::value child) {
  const std::size_t curIndent = m_pState->CurIndent();
  const std::size_t childCount = m_pState->CurGroupChildCount();

  if (child == EmitterNodeType::NoType)
    return;

  if (!m_pState->HasBegunContent()) {
    if (childCount > 0) {
      m_stream << "\n";
    }
    if (m_stream.comment()) {
      m_stream << "\n";
    }
    m_stream << IndentTo(curIndent);
    m_stream << "?";
  }

  switch (child) {
    case EmitterNodeType::NoType:
      break;
    case EmitterNodeType::Property:
    case EmitterNodeType::Scalar:
    case EmitterNodeType::FlowSeq:
    case EmitterNodeType::FlowMap:
      SpaceOrIndentTo(true, curIndent + 1);
      break;
    case EmitterNodeType::BlockSeq:
    case EmitterNodeType::BlockMap:
      if (m_pState->HasBegunContent())
        m_stream << "\n";
      break;
  }
}